

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O1

bool anon_unknown.dwarf_22493e::checkPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int lx,int rx,int ly,int ry,int width)

{
  float *pfVar1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  long *plVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  bool local_76;
  long local_70;
  long local_68;
  
  local_76 = ry < ly;
  if (ly <= ry) {
    local_70 = (long)ly * 2;
    iVar12 = ly * width;
    local_68 = (long)ly;
    do {
      if (lx <= rx) {
        lVar11 = (long)lx;
        iVar6 = lx;
        bVar2 = rx < lx;
        do {
          iVar7 = (iVar12 + iVar6) % 0x801;
          fVar13 = (float)iVar7;
          fVar9 = ABS(fVar13);
          uVar8 = (uint)fVar13 >> 0x10 & 0x8000;
          if ((uint)fVar9 < 0x38800000) {
            if ((0x33000000 < (uint)fVar9) &&
               (uVar10 = (uint)fVar9 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar9 >> 0x17),
               uVar8 = uVar8 | uVar10 >> (0x7eU - cVar3 & 0x1f),
               0x80000000 < uVar10 << (cVar3 + 0xa2U & 0x1f))) {
              uVar8 = uVar8 + 1;
            }
          }
          else if ((uint)fVar9 < 0x7f800000) {
            if ((uint)fVar9 < 0x477ff000) {
              uVar8 = (int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd | uVar8;
            }
            else {
              uVar8 = uVar8 | 0x7c00;
            }
          }
          else {
            uVar8 = uVar8 | 0x7c00;
            if (fVar9 != INFINITY) {
              uVar10 = (uint)fVar9 >> 0xd & 0x3ff;
              uVar8 = uVar8 | uVar10 | (uint)(uVar10 == 0);
            }
          }
          fVar9 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(uint16_t *)
                                    ((long)&ph->_data[lVar11]._h + ph->_sizeY * local_70) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)(uVar8 & 0xffff) * 4);
          if ((fVar9 != *pfVar1) || (NAN(fVar9) || NAN(*pfVar1))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_68);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
            poVar4 = (ostream *)
                     ::operator<<(poVar4,(half)*(uint16_t *)
                                                ((long)&ph->_data[lVar11]._h + ph->_sizeY * local_70
                                                ));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", should be ",0xc);
            plVar5 = (long *)std::ostream::operator<<(poVar4,iVar7);
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            std::ostream::flush();
            std::ostream::flush();
            if (!bVar2) {
              return local_76;
            }
            break;
          }
          bVar2 = rx <= lVar11;
          iVar6 = iVar6 + 1;
          lVar11 = lVar11 + 1;
        } while (rx + 1 != iVar6);
      }
      lVar11 = local_68 + 1;
      local_76 = ry <= local_68;
      local_70 = local_70 + 2;
      iVar12 = iVar12 + width;
      local_68 = lVar11;
    } while (ry + 1 != (int)lVar11);
  }
  return local_76;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T> (((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl
                     << flush;
                return false;
            }
    return true;
}